

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.cpp
# Opt level: O2

void duckdb::ListFlattenFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  idx_t count;
  long lVar1;
  bool bVar2;
  reference this;
  Vector *pVVar3;
  idx_t iVar4;
  Vector *this_00;
  idx_t iVar5;
  long lVar6;
  sel_t sVar7;
  idx_t outer_raw_idx_1;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t outer_raw_idx;
  data_ptr_t pdVar13;
  SelectionVector sel;
  UnifiedVectorFormat outer_format;
  UnifiedVectorFormat inner_format;
  UnifiedVectorFormat items_format;
  
  pdVar13 = result->data;
  FlatVector::VerifyFlatVector(result);
  UnifiedVectorFormat::UnifiedVectorFormat(&outer_format);
  UnifiedVectorFormat::UnifiedVectorFormat(&inner_format);
  UnifiedVectorFormat::UnifiedVectorFormat(&items_format);
  this = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  count = args->count;
  Vector::ToUnifiedFormat(this,count,&outer_format);
  if ((this->type).id_ == SQLNULL) {
    Vector::Reference(result,this);
  }
  else {
    pVVar3 = ListVector::GetEntry(this);
    iVar4 = ListVector::GetListSize(this);
    Vector::ToUnifiedFormat(pVVar3,iVar4,&inner_format);
    if ((pVVar3->type).id_ == SQLNULL) {
      for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
        iVar8 = iVar4;
        if ((outer_format.sel)->sel_vector != (sel_t *)0x0) {
          iVar8 = (idx_t)(outer_format.sel)->sel_vector[iVar4];
        }
        if ((outer_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((outer_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [iVar8 >> 6] >> (iVar8 & 0x3f) & 1) != 0)) {
          pdVar13[0] = '\0';
          pdVar13[1] = '\0';
          pdVar13[2] = '\0';
          pdVar13[3] = '\0';
          pdVar13[4] = '\0';
          pdVar13[5] = '\0';
          pdVar13[6] = '\0';
          pdVar13[7] = '\0';
          pdVar13[8] = '\0';
          pdVar13[9] = '\0';
          pdVar13[10] = '\0';
          pdVar13[0xb] = '\0';
          pdVar13[0xc] = '\0';
          pdVar13[0xd] = '\0';
          pdVar13[0xe] = '\0';
          pdVar13[0xf] = '\0';
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar4);
        }
        pdVar13 = pdVar13 + 0x10;
      }
      bVar2 = DataChunk::AllConstant(args);
      if (bVar2) {
        Vector::SetVectorType(result,CONSTANT_VECTOR);
      }
    }
    else {
      this_00 = ListVector::GetEntry(pVVar3);
      iVar4 = ListVector::GetListSize(pVVar3);
      Vector::ToUnifiedFormat(this_00,iVar4,&items_format);
      iVar4 = 0;
      for (iVar8 = 0; iVar8 != count; iVar8 = iVar8 + 1) {
        iVar5 = iVar8;
        if ((outer_format.sel)->sel_vector != (sel_t *)0x0) {
          iVar5 = (idx_t)(outer_format.sel)->sel_vector[iVar8];
        }
        if ((outer_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((outer_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0)) {
          uVar9 = *(ulong *)(outer_format.data + iVar5 * 0x10);
          uVar11 = *(long *)(outer_format.data + iVar5 * 0x10 + 8) + uVar9;
          for (; uVar9 < uVar11; uVar9 = uVar9 + 1) {
            uVar10 = uVar9;
            if ((inner_format.sel)->sel_vector != (sel_t *)0x0) {
              uVar10 = (ulong)(inner_format.sel)->sel_vector[uVar9];
            }
            if ((inner_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0) ||
               ((inner_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0)) {
              iVar4 = iVar4 + *(long *)(inner_format.data + uVar10 * 0x10 + 8);
            }
          }
        }
      }
      SelectionVector::SelectionVector(&sel,iVar4);
      iVar4 = 0;
      for (iVar8 = 0; iVar8 != count; iVar8 = iVar8 + 1) {
        iVar5 = iVar8;
        if ((outer_format.sel)->sel_vector != (sel_t *)0x0) {
          iVar5 = (idx_t)(outer_format.sel)->sel_vector[iVar8];
        }
        if ((outer_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((outer_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0)) {
          uVar9 = *(ulong *)(outer_format.data + iVar5 * 0x10);
          uVar11 = *(long *)(outer_format.data + iVar5 * 0x10 + 8) + uVar9;
          lVar6 = 0;
          iVar5 = iVar4;
          for (; uVar9 < uVar11; uVar9 = uVar9 + 1) {
            uVar10 = uVar9;
            if ((inner_format.sel)->sel_vector != (sel_t *)0x0) {
              uVar10 = (ulong)(inner_format.sel)->sel_vector[uVar9];
            }
            if ((inner_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0) ||
               ((inner_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0)) {
              uVar12 = *(ulong *)(inner_format.data + uVar10 * 0x10);
              lVar1 = *(long *)(inner_format.data + uVar10 * 0x10 + 8);
              uVar10 = uVar12 + lVar1;
              for (; uVar12 < uVar10; uVar12 = uVar12 + 1) {
                sVar7 = (sel_t)uVar12;
                if ((items_format.sel)->sel_vector != (sel_t *)0x0) {
                  sVar7 = (items_format.sel)->sel_vector[uVar12];
                }
                sel.sel_vector[iVar5] = sVar7;
                iVar5 = iVar5 + 1;
              }
              lVar6 = lVar6 + lVar1;
            }
          }
          *(idx_t *)(pdVar13 + iVar8 * 0x10) = iVar4;
          *(long *)(pdVar13 + iVar8 * 0x10 + 8) = lVar6;
          iVar4 = iVar5;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar8);
        }
      }
      ListVector::SetListSize(result,iVar4);
      pVVar3 = ListVector::GetEntry(result);
      Vector::Slice(pVVar3,this_00,&sel,iVar4);
      Vector::Flatten(pVVar3,iVar4);
      bVar2 = DataChunk::AllConstant(args);
      if (bVar2) {
        Vector::SetVectorType(result,CONSTANT_VECTOR);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&items_format);
  UnifiedVectorFormat::~UnifiedVectorFormat(&inner_format);
  UnifiedVectorFormat::~UnifiedVectorFormat(&outer_format);
  return;
}

Assistant:

static void ListFlattenFunction(DataChunk &args, ExpressionState &, Vector &result) {

	const auto flat_list_data = FlatVector::GetData<list_entry_t>(result);
	auto &flat_list_mask = FlatVector::Validity(result);

	UnifiedVectorFormat outer_format;
	UnifiedVectorFormat inner_format;
	UnifiedVectorFormat items_format;

	// Setup outer vec;
	auto &outer_vec = args.data[0];
	const auto outer_count = args.size();
	outer_vec.ToUnifiedFormat(outer_count, outer_format);

	// Special case: outer list is all-null
	if (outer_vec.GetType().id() == LogicalTypeId::SQLNULL) {
		result.Reference(outer_vec);
		return;
	}

	// Setup inner vec
	auto &inner_vec = ListVector::GetEntry(outer_vec);
	const auto inner_count = ListVector::GetListSize(outer_vec);
	inner_vec.ToUnifiedFormat(inner_count, inner_format);

	// Special case: inner list is all-null
	if (inner_vec.GetType().id() == LogicalTypeId::SQLNULL) {
		for (idx_t outer_raw_idx = 0; outer_raw_idx < outer_count; outer_raw_idx++) {
			const auto outer_idx = outer_format.sel->get_index(outer_raw_idx);
			if (!outer_format.validity.RowIsValid(outer_idx)) {
				flat_list_mask.SetInvalid(outer_raw_idx);
				continue;
			}
			flat_list_data[outer_raw_idx].offset = 0;
			flat_list_data[outer_raw_idx].length = 0;
		}
		if (args.AllConstant()) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
		}
		return;
	}

	// Setup items vec
	auto &items_vec = ListVector::GetEntry(inner_vec);
	const auto items_count = ListVector::GetListSize(inner_vec);
	items_vec.ToUnifiedFormat(items_count, items_format);

	// First pass: Figure out the total amount of items.
	// This can be more than items_count if the inner list reference the same item(s) multiple times.

	idx_t total_items = 0;

	const auto outer_data = UnifiedVectorFormat::GetData<list_entry_t>(outer_format);
	const auto inner_data = UnifiedVectorFormat::GetData<list_entry_t>(inner_format);

	for (idx_t outer_raw_idx = 0; outer_raw_idx < outer_count; outer_raw_idx++) {
		const auto outer_idx = outer_format.sel->get_index(outer_raw_idx);

		if (!outer_format.validity.RowIsValid(outer_idx)) {
			continue;
		}

		const auto &outer_entry = outer_data[outer_idx];

		for (idx_t inner_raw_idx = outer_entry.offset; inner_raw_idx < outer_entry.offset + outer_entry.length;
		     inner_raw_idx++) {
			const auto inner_idx = inner_format.sel->get_index(inner_raw_idx);

			if (!inner_format.validity.RowIsValid(inner_idx)) {
				continue;
			}

			const auto &inner_entry = inner_data[inner_idx];

			total_items += inner_entry.length;
		}
	}

	// Now we know the total amount of items, we can create our selection vector.
	SelectionVector sel(total_items);
	idx_t sel_idx = 0;

	// Second pass: Fill the selection vector (and the result list entries)

	for (idx_t outer_raw_idx = 0; outer_raw_idx < outer_count; outer_raw_idx++) {
		const auto outer_idx = outer_format.sel->get_index(outer_raw_idx);

		if (!outer_format.validity.RowIsValid(outer_idx)) {
			flat_list_mask.SetInvalid(outer_raw_idx);
			continue;
		}

		const auto &outer_entry = outer_data[outer_idx];

		list_entry_t list_entry = {sel_idx, 0};

		for (idx_t inner_raw_idx = outer_entry.offset; inner_raw_idx < outer_entry.offset + outer_entry.length;
		     inner_raw_idx++) {
			const auto inner_idx = inner_format.sel->get_index(inner_raw_idx);

			if (!inner_format.validity.RowIsValid(inner_idx)) {
				continue;
			}

			const auto &inner_entry = inner_data[inner_idx];

			list_entry.length += inner_entry.length;

			for (idx_t elem_raw_idx = inner_entry.offset; elem_raw_idx < inner_entry.offset + inner_entry.length;
			     elem_raw_idx++) {
				const auto elem_idx = items_format.sel->get_index(elem_raw_idx);

				sel.set_index(sel_idx, elem_idx);
				sel_idx++;
			}
		}

		// Assign the result list entry
		flat_list_data[outer_raw_idx] = list_entry;
	}

	// Now assing the result
	ListVector::SetListSize(result, sel_idx);

	auto &result_child_vector = ListVector::GetEntry(result);
	result_child_vector.Slice(items_vec, sel, sel_idx);
	result_child_vector.Flatten(sel_idx);

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}